

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatprint.c
# Opt level: O3

char * ec_soeerror2string(uint16 errorcode)

{
  uint16 *puVar1;
  char *pcVar2;
  
  pcVar2 = ec_ALstatuscodelist[0x33].ALstatuscodedescription + 8;
  do {
    puVar1 = (uint16 *)(pcVar2 + 0x80);
    pcVar2 = pcVar2 + 0x82;
    if (*puVar1 == 0xffff) {
      return pcVar2;
    }
  } while (*puVar1 != errorcode);
  return pcVar2;
}

Assistant:

char* ec_soeerror2string( uint16 errorcode)
{
   int i = 0;

   while ( (ec_soeerrorlist[i].errorcode != 0xffff) && 
           (ec_soeerrorlist[i].errorcode != errorcode) ) 
   {
      i++;
   }
   
   return (char *) ec_soeerrorlist[i].errordescription;
}